

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::ImageDescriptorCase::genExtensionDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = *(int *)((long)this + 0x8c);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar1 == 6) {
    pcVar3 = "#extension GL_OES_texture_cube_map_array : require\n";
    pcVar2 = "";
  }
  else {
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageDescriptorCase::genExtensionDeclarations (vk::VkShaderStageFlagBits stage) const
{
	DE_UNREF(stage);

	if (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)
		return "#extension GL_OES_texture_cube_map_array : require\n";
	else
		return "";
}